

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int lx,int ly)

{
  if (this->_toYa != (ToYa *)0x0) {
    ToYa::writeTile(this->_toYa,dx,dy,lx,ly);
    return;
  }
  TiledOutputFile::writeTile(this->_outputFile,dx,dy,lx,ly);
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->writeTile (dx, dy, lx, ly);
    }
    else
    {
        _outputFile->writeTile (dx, dy, lx, ly);
    }
}